

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O3

int __thiscall
MlmWrap::sendMessage
          (MlmWrap *this,char *address,char *subject,TrodesMsg *tmsg,char *tracker,uint32_t timeout)

{
  mutex *__mutex;
  _Alloc_hider _Var1;
  int iVar2;
  zmsg_t *pzVar3;
  undefined8 uVar4;
  zmsg_t *zmsg;
  string local_50;
  
  TrodesMsg::getformat_abi_cxx11_(&local_50,tmsg);
  _Var1._M_p = local_50._M_dataplus._M_p;
  pzVar3 = TrodesMsg::getzmsg(tmsg);
  zmsg = czhelp_zmsg_create("ssss4sm","MSG",address,subject,tracker,timeout,_Var1._M_p,pzVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  __mutex = &this->actormutex;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    iVar2 = zactor_send(this->actor,&zmsg);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return iVar2;
  }
  uVar4 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar4);
}

Assistant:

int MlmWrap::sendMessage(const char *address, const char *subject, TrodesMsg &tmsg, const char *tracker, uint32_t timeout){
    int rc = -1;
    zmsg_t *zmsg = czhelp_zmsg_create("ssss4sm", mailboxmsg, address, subject, tracker,
                                       timeout, tmsg.getformat().c_str(), tmsg.getzmsg());
    std::lock_guard<std::mutex> lock(actormutex);
    rc = zactor_send(actor, &zmsg);
    return rc;
}